

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSqueezeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  uint uVar2;
  string *psVar3;
  string *psVar4;
  bool bVar5;
  LayerUnion LVar6;
  long *plVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  undefined8 *puVar9;
  size_type *psVar10;
  pointer pcVar11;
  string *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  _Alloc_hider _Var18;
  string *psVar19;
  string *psVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  int iVar23;
  string err_1;
  int a;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  Result r;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  iterator iStack_a0;
  int *local_98;
  int local_8c;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  undefined1 local_78 [24];
  size_t local_60;
  pointer local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  Result::Result((Result *)&local_58);
  validateInputCount((Result *)local_88,layer,1,1);
  local_58 = (pointer)local_88;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_80);
  if (local_80._M_p != local_78 + 8) {
    operator_delete(local_80._M_p,(ulong)(local_78._8_8_ + 1));
  }
  bVar5 = Result::good((Result *)&local_58);
  if (bVar5) {
    validateOutputCount((Result *)local_88,layer,1,1);
    local_58 = (pointer)local_88;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_80);
    if (local_80._M_p != local_78 + 8) {
      operator_delete(local_80._M_p,(ulong)(local_78._8_8_ + 1));
    }
  }
  if (layer->_oneof_case_[0] == 0x460) {
    LVar6 = layer->layer_;
  }
  else {
    LVar6.squeeze_ = Specification::SqueezeLayerParams::default_instance();
  }
  if ((LVar6.squeeze_)->squeezeall_ == false) {
    if (layer->_oneof_case_[0] == 0x460) {
      LVar6 = layer->layer_;
    }
    else {
      LVar6.squeeze_ = Specification::SqueezeLayerParams::default_instance();
    }
    if (((LVar6.convolution_)->kernelsize_).current_size_ != 0) {
      local_80._M_p = local_80._M_p & 0xffffffff00000000;
      iVar23 = 0;
      local_78._0_8_ = (string *)0x0;
      local_60 = 0;
      local_78._8_8_ = (string *)&local_80;
      local_78._16_8_ = (string *)&local_80;
      do {
        if (layer->_oneof_case_[0] == 0x460) {
          LVar6 = layer->layer_;
        }
        else {
          LVar6.squeeze_ = Specification::SqueezeLayerParams::default_instance();
        }
        if (((LVar6.convolution_)->kernelsize_).current_size_ <= iVar23) {
          if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
             ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1))
          goto LAB_002d812f;
          uVar2 = *(uint *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                  [0] + 0x24);
          iVar23 = *(int *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                  [0] + 0x24);
          if (layer->_oneof_case_[0] == 0x460) {
            LVar6 = layer->layer_;
          }
          else {
            LVar6.squeeze_ = Specification::SqueezeLayerParams::default_instance();
          }
          iVar14 = ((LVar6.convolution_)->kernelsize_).current_size_;
          if ((uVar2 == 1) || (iVar23 + iVar14 == uVar2)) {
            local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
            iStack_a0._M_current = (int *)0x0;
            local_98 = (int *)0x0;
            iVar23 = 0;
            goto LAB_002d7e2e;
          }
          psVar3 = (layer->name_).ptr_;
          pcVar11 = (psVar3->_M_dataplus)._M_p;
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar11,pcVar11 + psVar3->_M_string_length);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x31ac74);
          psVar10 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_e8.field_2._M_allocated_capacity = *psVar10;
            local_e8.field_2._8_8_ = plVar7[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *psVar10;
            local_e8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_e8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          psVar10 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_108.field_2._M_allocated_capacity = *psVar10;
            local_108.field_2._8_8_ = puVar9[3];
          }
          else {
            local_108.field_2._M_allocated_capacity = *psVar10;
            local_108._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_108._M_string_length = puVar9[1];
          *puVar9 = psVar10;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
          goto LAB_002d80bb;
        }
        if (layer->_oneof_case_[0] == 0x460) {
          LVar6 = layer->layer_;
        }
        else {
          LVar6.squeeze_ = Specification::SqueezeLayerParams::default_instance();
        }
        plVar7 = google::protobuf::RepeatedField<long>::Get(&(LVar6.reshape_)->targetshape_,iVar23);
        iVar14 = (int)*plVar7;
        local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)CONCAT44(local_a8._4_4_,iVar14);
        psVar4 = (string *)local_78._0_8_;
        psVar20 = (string *)&local_80;
        if ((string *)local_78._0_8_ != (string *)0x0) {
          do {
            psVar19 = psVar20;
            psVar12 = psVar4;
            iVar1 = *(int *)(psVar12 + 0x20);
            psVar20 = psVar12;
            if (iVar1 < iVar14) {
              psVar20 = psVar19;
            }
            psVar4 = *(string **)(psVar12 + (ulong)(iVar1 < iVar14) * 8 + 0x10);
          } while (*(string **)(psVar12 + (ulong)(iVar1 < iVar14) * 8 + 0x10) != (string *)0x0);
          if (psVar20 != (string *)&local_80) {
            if (iVar1 < iVar14) {
              psVar12 = psVar19;
            }
            if (*(int *)(psVar12 + 0x20) <= iVar14) goto LAB_002d7c3f;
          }
        }
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   local_88,(int *)&local_a8);
        iVar23 = iVar23 + 1;
      } while( true );
    }
    psVar3 = (layer->name_).ptr_;
    pcVar11 = (psVar3->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,pcVar11,pcVar11 + psVar3->_M_string_length);
    puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_e8,0,(char *)0x0,0x31ac74);
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108.field_2._8_8_ = puVar9[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_108._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_108);
    pcVar11 = (pointer)(puVar9 + 2);
    if ((pointer)*puVar9 == pcVar11) {
      local_78._0_8_ = *(undefined8 *)pcVar11;
      local_78._8_8_ = puVar9[3];
      local_88 = (undefined1  [8])local_78;
    }
    else {
      local_78._0_8_ = *(undefined8 *)pcVar11;
      local_88 = (undefined1  [8])*puVar9;
    }
    local_80._M_p = (pointer)puVar9[1];
    *puVar9 = pcVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    if (local_88 != (undefined1  [8])local_78) {
      operator_delete((void *)local_88,(ulong)(local_78._0_8_ + 1));
    }
    goto LAB_002d8366;
  }
  goto LAB_002d813c;
LAB_002d7c3f:
  psVar3 = (layer->name_).ptr_;
  pcVar11 = (psVar3->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar11,pcVar11 + psVar3->_M_string_length);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x31ac74);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_e8.field_2._M_allocated_capacity = *psVar10;
    local_e8.field_2._8_8_ = plVar7[3];
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  }
  else {
    local_e8.field_2._M_allocated_capacity = *psVar10;
    local_e8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_e8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  psVar10 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_108.field_2._M_allocated_capacity = *psVar10;
    local_108.field_2._8_8_ = puVar9[3];
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar10;
    local_108._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_108._M_string_length = puVar9[1];
  *puVar9 = psVar10;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
LAB_002d80bb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    uVar16 = local_108.field_2._M_allocated_capacity + 1;
    _Var18._M_p = local_108._M_dataplus._M_p;
LAB_002d8354:
    operator_delete(_Var18._M_p,uVar16);
  }
LAB_002d8359:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_88);
  goto LAB_002d8366;
  while( true ) {
    if (_Var8._M_current == local_98) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&local_8c);
    }
    else {
      *iStack_a0._M_current = local_8c;
      iStack_a0._M_current = iStack_a0._M_current + 1;
    }
    iVar23 = iVar23 + 1;
    if (iVar14 == iVar23) break;
LAB_002d7e2e:
    if (layer->_oneof_case_[0] == 0x460) {
      LVar6 = layer->layer_;
    }
    else {
      LVar6.squeeze_ = Specification::SqueezeLayerParams::default_instance();
    }
    plVar7 = google::protobuf::RepeatedField<long>::Get(&(LVar6.reshape_)->targetshape_,iVar23);
    local_8c = ((int)*plVar7 >> 0x1f & uVar2) + (int)*plVar7;
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (local_a8,iStack_a0._M_current,&local_8c);
    if (_Var8._M_current != iStack_a0._M_current) {
      psVar3 = (layer->name_).ptr_;
      pcVar11 = (psVar3->_M_dataplus)._M_p;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar11,pcVar11 + psVar3->_M_string_length);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x31ac74);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_e8.field_2._M_allocated_capacity = *psVar10;
        local_e8.field_2._8_8_ = plVar7[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar10;
        local_e8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_108.field_2._M_allocated_capacity = *psVar10;
        local_108.field_2._8_8_ = puVar9[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar10;
        local_108._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_108._M_string_length = puVar9[1];
      *puVar9 = psVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
      goto LAB_002d832c;
    }
  }
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_a8->_M_local_buf + 4);
  iVar23 = *(int *)local_a8;
  paVar17 = local_a8;
  paVar21 = local_a8;
  paVar22 = paVar13;
  iVar14 = iVar23;
  if (paVar13 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_a0._M_current &&
      local_a8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_a0._M_current) {
    do {
      iVar1 = *(int *)paVar22;
      iVar15 = iVar14;
      if (iVar14 <= iVar1) {
        iVar15 = iVar1;
      }
      if (iVar14 < iVar1) {
        paVar21 = paVar22;
      }
      paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar22 + 4);
      iVar14 = iVar15;
    } while (paVar22 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)iStack_a0._M_current);
    do {
      if (*(int *)paVar13 < iVar23) {
        paVar17 = paVar13;
        iVar23 = *(int *)paVar13;
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar13 + 4);
      iVar14 = *(int *)paVar21;
    } while (paVar13 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)iStack_a0._M_current);
  }
  if (((int)uVar2 <= iVar14) || (*(int *)paVar17 < 0)) {
    psVar3 = (layer->name_).ptr_;
    pcVar11 = (psVar3->_M_dataplus)._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar11,pcVar11 + psVar3->_M_string_length);
    std::operator+(&local_e8,"Squeeze Layer \'",&local_c8);
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108.field_2._8_8_ = puVar9[3];
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar10;
      local_108._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_108._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_108);
LAB_002d832c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar16 = (long)local_98 - (long)local_a8;
      _Var18._M_p = (pointer)local_a8;
      goto LAB_002d8354;
    }
    goto LAB_002d8359;
  }
  operator_delete(local_a8,(long)local_98 - (long)local_a8);
LAB_002d812f:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_88);
LAB_002d813c:
  *(pointer *)__return_storage_ptr__ = local_58;
  paVar13 = &(__return_storage_ptr__->m_message).field_2;
  (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p == &local_40) {
    paVar13->_M_allocated_capacity =
         CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_40._8_8_;
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_50._M_p;
    (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
         CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]);
  }
  (__return_storage_ptr__->m_message)._M_string_length = local_48;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
LAB_002d8366:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSqueezeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!layer.squeeze().squeezeall()) {

        if (layer.squeeze().axes_size() == 0) {
            std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        // either all values in axes must be positive or all negative
        std::set<int> axes_set;
        for (int i=0; i<layer.squeeze().axes_size(); i++) {
            int a = (int)layer.squeeze().axes(i);
            if (axes_set.find(a) != axes_set.end()) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            } else {
                axes_set.insert(a);
            }
        }

        if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
            int input_rank = static_cast<int>(layer.inputtensor(0).rank());
            int output_rank = static_cast<int>(layer.outputtensor(0).rank());
            int axes_length = layer.squeeze().axes_size();

            if (input_rank != 1) {
                if (output_rank + axes_length != input_rank) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': output rank plus the length of the axes parameter must equal input rank.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }

            std::vector<int> axes;
            for (int i=0; i<axes_length; i++) {
                int a = (int)layer.squeeze().axes(i);
                if (a < 0) {
                    a = input_rank + a;
                }
                if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                    std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
                axes.push_back(a);
            }

            int max_value = *std::max_element(axes.begin(), axes.end());
            int min_value = *std::min_element(axes.begin(), axes.end());
            if (max_value > input_rank - 1 || min_value < 0) {
                std::string err = "Squeeze Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the input rank.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
        }
    }

    return r;
}